

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnInitExprF64ConstExpr
          (BinaryReaderIR *this,Index index,uint64_t value)

{
  intrusive_list<wabt::Expr> *this_00;
  Const local_90;
  undefined1 local_58 [8];
  Location loc;
  long *local_30;
  
  GetLocation((Location *)local_58,this);
  this_00 = this->current_init_expr_;
  Const::Const(&local_90,value,(Location *)local_58);
  MakeUnique<wabt::ConstExpr,wabt::Const,wabt::Location&>
            ((wabt *)&local_30,&local_90,(Location *)local_58);
  loc.field_1._8_8_ = local_30;
  local_30 = (long *)0x0;
  intrusive_list<wabt::Expr>::push_back
            (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8));
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  loc.field_1._8_8_ = 0;
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprF64ConstExpr(Index index, uint64_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::F64(value, loc), loc));
  return Result::Ok;
}